

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_findAll(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  CVmObject *pCVar3;
  char *pcVar4;
  vm_val_t *pvVar5;
  size_t sVar6;
  uint *in_RCX;
  long in_RDX;
  vm_val_t *in_RDI;
  size_t skip;
  re_group_register_conflict *reg;
  int i;
  int gc_wanted;
  int gc_actual;
  int fargc;
  vm_val_t ele;
  char *nxt;
  int match_bofs;
  int match_len;
  int match_cofs;
  int cnt;
  CVmObjList *lst;
  CVmFuncPtr fd;
  vm_rcdesc rc;
  int func_argc_max;
  int func_argc_min;
  vm_val_t *func;
  CVmObjPattern *targpat;
  char *targstr;
  vm_val_t *targ;
  char *basestr;
  size_t len;
  uint orig_argc;
  vm_val_t *in_stack_fffffffffffffe98;
  CVmObjList *in_stack_fffffffffffffea0;
  vm_rcdesc *in_stack_fffffffffffffea8;
  vm_val_t *in_stack_fffffffffffffeb0;
  vm_val_t *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  vm_val_t *this;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  CVmObject *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar7;
  vm_val_t *in_stack_fffffffffffffee8;
  re_group_register_conflict *local_110;
  int local_108;
  int local_104;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int *in_stack_ffffffffffffff08;
  undefined1 local_dc [8];
  int local_d4;
  CVmObject *local_d0;
  vm_rcdesc local_c0;
  int local_78;
  int local_74;
  vm_val_t *local_70;
  CVmObject *local_68;
  char *local_60;
  vm_val_t *local_58;
  long local_50;
  size_t local_48;
  uint local_2c;
  long local_20;
  vm_val_t *local_10;
  
  if (in_RCX == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *in_RCX;
  }
  local_2c = uVar7;
  local_20 = in_RDX;
  local_10 = in_RDI;
  if ((getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_findAll::desc,1,1);
    __cxa_guard_release(&getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_fffffffffffffea8,(uint *)in_stack_fffffffffffffea0,
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffe98);
  if (iVar1 != 0) {
    return 1;
  }
  local_48 = vmb_get_len((char *)0x390e83);
  local_50 = local_20 + 2;
  local_20 = local_50;
  local_58 = CVmStack::get(0);
  local_60 = (char *)0x0;
  local_68 = (CVmObject *)0x0;
  local_60 = vm_val_t::get_as_string(in_stack_fffffffffffffe98);
  if (local_60 != (char *)0x0) goto LAB_00390f6b;
  if (local_58->typ == VM_OBJ) {
    pCVar3 = vm_objp(0);
    iVar1 = (*pCVar3->_vptr_CVmObject[1])(pCVar3,CVmObjPattern::metaclass_reg_);
    if (iVar1 == 0) goto LAB_00390f41;
    in_stack_fffffffffffffed8 = vm_objp(0);
  }
  else {
LAB_00390f41:
    in_stack_fffffffffffffed8 = (CVmObject *)0x0;
  }
  local_68 = in_stack_fffffffffffffed8;
  if (in_stack_fffffffffffffed8 == (CVmObject *)0x0) {
    err_throw(0);
  }
LAB_00390f6b:
  local_70 = (vm_val_t *)0x0;
  local_74 = 0;
  local_78 = 0;
  vm_rcdesc::vm_rcdesc(&local_c0);
  if ((1 < local_2c) && (local_70 = CVmStack::get(1), local_70->typ != VM_NIL)) {
    iVar1 = vm_val_t::is_func_ptr(in_stack_fffffffffffffeb0);
    if (iVar1 == 0) {
      err_throw(0);
    }
    CVmFuncPtr::CVmFuncPtr((CVmFuncPtr *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_74 = CVmFuncPtr::get_min_argc((CVmFuncPtr *)0x390ffd);
    iVar1 = CVmFuncPtr::is_varargs((CVmFuncPtr *)0x391011);
    if (iVar1 == 0) {
      in_stack_fffffffffffffed4 = CVmFuncPtr::get_max_argc((CVmFuncPtr *)in_stack_fffffffffffffea0);
      local_78 = in_stack_fffffffffffffed4;
    }
    else {
      in_stack_fffffffffffffed4 = -1;
      local_78 = in_stack_fffffffffffffed4;
    }
  }
  this = local_10;
  vVar2 = CVmObjList::create((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                             (size_t)in_stack_fffffffffffffe98);
  vm_val_t::set_obj(this,vVar2);
  local_d0 = vm_objp(0);
  CVmObjList::cons_clear(in_stack_fffffffffffffea0);
  CVmStack::push(local_10);
  local_d4 = 0;
  while (local_48 != 0) {
    in_stack_fffffffffffffe98 = (vm_val_t *)(local_dc + 4);
    in_stack_fffffffffffffea0 = (CVmObjList *)local_dc;
    pcVar4 = find_substr(in_stack_fffffffffffffee8,(char *)CONCAT44(uVar7,in_stack_fffffffffffffee0)
                         ,(char *)in_stack_fffffffffffffed8,
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),(char *)this,
                         (CVmObjPattern *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         in_stack_ffffffffffffff08);
    if (pcVar4 == (char *)0x0) break;
    iVar1 = (int)local_20;
    if (local_70 == (vm_val_t *)0x0) {
      vVar2 = create((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                     (char *)in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffff08,vVar2);
    }
    else {
      in_stack_ffffffffffffff04 = 0;
      in_stack_ffffffffffffff00 =
           CRegexSearcherSimple::get_group_cnt(G_bif_tads_globals_X->rex_searcher);
      in_stack_fffffffffffffec4 = in_stack_ffffffffffffff00;
      if (local_78 != -1) {
        in_stack_fffffffffffffec4 = local_78 + -2;
      }
      local_104 = in_stack_fffffffffffffec4;
      if (in_stack_fffffffffffffec4 < local_74 + -2) {
        local_104 = local_74 + -2;
      }
      local_108 = local_104;
      while (0 < local_108) {
        local_110 = (re_group_register_conflict *)0x0;
        local_108 = local_108 + -1;
        if (local_108 < in_stack_ffffffffffffff00) {
          local_110 = CRegexSearcherSimple::get_group_reg
                                (G_bif_tads_globals_X->rex_searcher,local_108);
        }
        if (((local_110 == (re_group_register_conflict *)0x0) || (local_110->start_ofs < 0)) ||
           (local_110->end_ofs < 0)) {
          pvVar5 = CVmStack::push();
          vm_val_t::set_nil(pvVar5);
        }
        else {
          in_stack_fffffffffffffeb8 = CVmStack::push();
          vVar2 = create((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                         (char *)in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
          vm_val_t::set_obj(in_stack_fffffffffffffeb8,vVar2);
        }
        in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1;
      }
      if ((local_78 == -1) || (1 < local_78)) {
        in_stack_fffffffffffffeb0 = CVmStack::push();
        sVar6 = utf8_ptr::s_len((char *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8)
        ;
        vm_val_t::set_int(in_stack_fffffffffffffeb0,(int)sVar6 + 1);
        in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1;
      }
      if ((local_78 == -1) || (0 < local_78)) {
        in_stack_fffffffffffffea8 = (vm_rcdesc *)CVmStack::push();
        vVar2 = create((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                       (char *)in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
        vm_val_t::set_obj((vm_val_t *)in_stack_fffffffffffffea8,vVar2);
        in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1;
      }
      CVmRun::call_func_ptr
                ((CVmRun *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8,(uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                 in_stack_fffffffffffffea8,(uint)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      pvVar5 = CVmRun::get_r0();
      in_stack_ffffffffffffff08 = *(int **)pvVar5;
    }
    CVmObjList::cons_ensure_space
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (size_t)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
    CVmObjList::cons_set_element
              (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,(vm_val_t *)0x3913a2);
    in_stack_fffffffffffffee8 = (vm_val_t *)(long)(((int)pcVar4 - iVar1) + local_dc._0_4_);
    local_20 = (long)&in_stack_fffffffffffffee8->typ + local_20;
    local_48 = local_48 - (long)in_stack_fffffffffffffee8;
    if ((local_dc._0_4_ == 0) && (local_48 != 0)) {
      sVar6 = utf8_ptr::s_bytelen((char *)in_stack_fffffffffffffea0,
                                  (size_t)in_stack_fffffffffffffe98);
      local_20 = sVar6 + local_20;
    }
    local_d4 = local_d4 + 1;
  }
  CVmObjList::cons_set_len(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  CVmStack::discard(local_2c + 1);
  return 1;
}

Assistant:

int CVmObjString::getp_findAll(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val, const char *str,
                               uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* we have a simple string to find */
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the filter callback function, if present */
    vm_val_t *func = 0;
    int func_argc_min = 0, func_argc_max = 0;
    vm_rcdesc rc;
    if (orig_argc >= 2 && (func = G_stk->get(1))->typ != VM_NIL)
    {
        /* make sure it's a function */
        if (!func->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* note how many arguments the function accepts */
        CVmFuncPtr fd(vmg_ func);
        func_argc_min = fd.get_min_argc();
        func_argc_max = fd.is_varargs() ? -1 : fd.get_max_argc();
    }

    /* 
     *   create a tentative list for the results (we'll resize this as needed
     *   as we add elements) 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear it initially and push it for gc protection */
    lst->cons_clear();
    G_stk->push(retval);

    /* repeatedly search for the pattern */
    int cnt;
    for (cnt = 0 ; len != 0 ; ++cnt)
    {
        /* search for the next element */
        int match_cofs, match_len, match_bofs;
        const char *nxt = find_substr(
            vmg_ self_val, basestr, str, len, targstr, targpat,
            &match_cofs, &match_len);

        /* if we didn't find a match, we're done */
        if (nxt == 0)
            break;

        /* figure the byte offset of the match */
        match_bofs = nxt - str;

        /* call the callback, or just return the match text directly */
        vm_val_t ele;
        if (func == 0)
        {
            /* no callback - just use the match text, as a new string */
            ele.set_obj(CVmObjString::create(vmg_ FALSE, nxt, match_len));
        }
        else
        {
            /* we have a callback - push arguments */
            int fargc = 0;

            /*
             *   Figure out how many groups are populated, and how many the
             *   function expects.  If the function takes varargs, it expects
             *   all of the groups.  If it takes fixed arguments, it expects
             *   at most max_argc-2.  In addition, the function expects a
             *   minimum of min_argc-2 groups, and expects us to add nil
             *   arguments for any unpopulated groups to fill out that
             *   minimum.
             */
            int gc_actual = G_bif_tads_globals->rex_searcher->get_group_cnt();
            int gc_wanted = (func_argc_max == -1
                             ? gc_actual : func_argc_max - 2);
            if (gc_wanted < func_argc_min - 2)
                gc_wanted = func_argc_min - 2;

            /* push the groups, last to first */
            for (int i = gc_wanted ; i > 0 ; )
            {
                /* get the group, if it exists */
                const re_group_register *reg = 0;
                if (--i < gc_actual)
                {
                    /* valid group - get the group information */
                    reg = G_bif_tads_globals->rex_searcher->get_group_reg(i);
                }

                /* if the group is populated, push its text, otherwise nil */
                if (reg != 0 && reg->start_ofs >= 0 && reg->end_ofs >= 0)
                {
                    /* push the group text as a new string */
                    G_stk->push()->set_obj(CVmObjString::create(
                        vmg_ FALSE, basestr + reg->start_ofs,
                        reg->end_ofs - reg->start_ofs));
                }
                else
                {
                    /* unpopulated group - push nil */
                    G_stk->push()->set_nil();
                }

                /* count it */
                ++fargc;
            }

            /* if the index value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 2)
            {
                /* push the index of the match relative to basestr */
                G_stk->push()->set_int(
                    utf8_ptr::s_len(basestr, nxt - basestr) + 1);
                ++fargc;
            }

            /* if the match string value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 1)
            {
                /* push the match text */
                G_stk->push()->set_obj(
                    CVmObjString::create(vmg_ FALSE, nxt, match_len));
                ++fargc;
            }

            /* call the callback */
            G_interpreter->call_func_ptr(vmg_ func, fargc, &rc, 0);

            /* retrieve the return value */
            ele = *G_interpreter->get_r0();
        }

        /* add it to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        lst->cons_set_element(cnt, &ele);

        /* skip the matched text */
        size_t skip = match_bofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* finalize the list length */
    lst->cons_set_len(cnt);

    /* discard arguments and gc protection */
    G_stk->discard(orig_argc + 1);

    /* handled */
    return TRUE;
}